

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O0

void __thiscall SM83::ret<(SM83::Conditions)1>(SM83 *this)

{
  bool bVar1;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_std::basic_string_view<char>_>
  fmt;
  anon_union_2_2_fd64ea96_for_SM83_2 *args_6;
  string_view local_30;
  v11 *local_20;
  char *local_18;
  SM83 *local_10;
  SM83 *this_local;
  
  local_20 = (v11 *)0x15b5b0;
  local_18 = (char *)0x44;
  args_6 = &this->field_1;
  local_10 = this;
  local_30 = GetConditionString<(SM83::Conditions)1>(this);
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = local_18;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,std::basic_string_view<char,std::char_traits<char>>>
            (local_20,fmt,&args_6->bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,(unsigned_short *)&local_30,
             (basic_string_view<char,_std::char_traits<char>_> *)&args_6->field_1);
  bVar1 = MeetsCondition<(SM83::Conditions)1>(this);
  if (bVar1) {
    StackPop(this,&this->pc);
    Timer::AdvanceCycles(this->timer,8);
  }
  else {
    Timer::AdvanceCycles(this->timer,4);
  }
  return;
}

Assistant:

void SM83::ret() {
    if constexpr (cond == Conditions::None) {
        LTRACE("RET");
        
        StackPop(&pc);
        timer.AdvanceCycles(4);
    } else {
        LTRACE("RET {}", GetConditionString<cond>());

        if (MeetsCondition<cond>()) {
            StackPop(&pc);
            timer.AdvanceCycles(8);
        } else {
            timer.AdvanceCycles(4);
        }
    }
}